

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::ScriptContext::AddDynamicProfileInfo<Memory::WriteBarrierPtr>
          (ScriptContext *this,FunctionBody *functionBody,
          WriteBarrierPtr<Js::DynamicProfileInfo> *dynamicProfileInfo)

{
  SourceDynamicProfileManager *this_00;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_01;
  code *pcVar1;
  WriteBarrierPtr<Js::DynamicProfileInfo> WVar2;
  bool bVar3;
  uint32 uVar4;
  DynamicProfileInfo *in_RAX;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  SourceContextInfo *pSVar7;
  DynamicProfileInfo *pDVar8;
  WriteBarrierPtr<Js::DynamicProfileInfo> local_38;
  DynamicProfileInfo *newDynamicProfileInfo;
  
  local_38.ptr = in_RAX;
  pSVar5 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if (pSVar5 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x161e,"(functionBody->GetScriptContext() == this)",
                                "functionBody->GetScriptContext() == this");
    if (!bVar3) goto LAB_0079ff8a;
    *puVar6 = 0;
  }
  bVar3 = FunctionBody::HasValidSourceInfo(functionBody);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x161f,"(functionBody->HasValidSourceInfo())",
                                "functionBody->HasValidSourceInfo()");
    if (!bVar3) goto LAB_0079ff8a;
    *puVar6 = 0;
  }
  local_38 = (WriteBarrierPtr<Js::DynamicProfileInfo>)dynamicProfileInfo->ptr;
  pSVar7 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)functionBody);
  this_00 = (pSVar7->sourceDynamicProfileManager).ptr;
  if ((pSVar7->dwHostSourceContext == 0xffffffffffffffff) ||
     ((pSVar7->isHostDynamicDocument & 1U) != 0)) {
    if (this_00 == (SourceDynamicProfileManager *)0x0) {
      if (local_38.ptr == (DynamicProfileInfo *)0x0) {
        local_38.ptr = FunctionBody::AllocateDynamicProfile(functionBody);
      }
      WVar2.ptr = local_38.ptr;
      Memory::Recycler::WBSetBit((char *)dynamicProfileInfo);
      dynamicProfileInfo->ptr = (DynamicProfileInfo *)WVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(dynamicProfileInfo);
    }
    else {
      if (local_38.ptr == (DynamicProfileInfo *)0x0) {
        local_38.ptr = DynamicProfileInfo::New(this->recycler,functionBody,true);
        if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar3) goto LAB_0079ff8a;
          *puVar6 = 0;
        }
        SourceDynamicProfileManager::UpdateDynamicProfileInfo
                  (this_00,((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                            functionInfo.ptr)->functionId,local_38.ptr);
        WVar2.ptr = local_38.ptr;
        Memory::Recycler::WBSetBit((char *)dynamicProfileInfo);
        dynamicProfileInfo->ptr = (DynamicProfileInfo *)WVar2;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(dynamicProfileInfo);
      }
      if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) goto LAB_0079ff8a;
        *puVar6 = 0;
      }
      SourceDynamicProfileManager::MarkAsExecuted
                (this_00,((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                          functionInfo.ptr)->functionId);
      DynamicProfileInfo::UpdateFunctionInfo(local_38.ptr,functionBody,this->recycler);
    }
  }
  else {
    if (local_38.ptr == (DynamicProfileInfo *)0x0) {
      pDVar8 = FunctionBody::AllocateDynamicProfile(functionBody);
      local_38.ptr = pDVar8;
      Memory::Recycler::WBSetBit((char *)dynamicProfileInfo);
      dynamicProfileInfo->ptr = pDVar8;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(dynamicProfileInfo);
    }
    uVar4 = FunctionBody::GetInterpretedCount(functionBody);
    if (uVar4 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1643,"(functionBody->GetInterpretedCount() == 0)",
                                  "functionBody->GetInterpretedCount() == 0");
      if (!bVar3) goto LAB_0079ff8a;
      *puVar6 = 0;
    }
    this_01 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
    if (this_01 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Prepend
                (this_01,this->recycler,&local_38.ptr);
    }
    if (this->startupComplete == false) {
      if (this_00 == (SourceDynamicProfileManager *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x164d,"(profileManager)","profileManager");
        if (!bVar3) goto LAB_0079ff8a;
        *puVar6 = 0;
      }
      if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) goto LAB_0079ff8a;
        *puVar6 = 0;
      }
      SourceDynamicProfileManager::MarkAsExecuted
                (this_00,((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                          functionInfo.ptr)->functionId);
    }
  }
  if (dynamicProfileInfo->ptr == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1651,"(dynamicProfileInfo != nullptr)",
                                "dynamicProfileInfo != nullptr");
    if (!bVar3) {
LAB_0079ff8a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void ScriptContext::AddDynamicProfileInfo(
        FunctionBody * functionBody, BarrierT<DynamicProfileInfo>& dynamicProfileInfo)
    {
        Assert(functionBody->GetScriptContext() == this);
        Assert(functionBody->HasValidSourceInfo());

        DynamicProfileInfo * newDynamicProfileInfo = dynamicProfileInfo;
        // If it is a dynamic script - we should create a profile info bound to the threadContext for its lifetime.
        SourceContextInfo* sourceContextInfo = functionBody->GetSourceContextInfo();
        SourceDynamicProfileManager* profileManager = sourceContextInfo->sourceDynamicProfileManager;
        if (sourceContextInfo->IsDynamic())
        {
            if (profileManager != nullptr)
            {
                // There is an in-memory cache and dynamic profile info is coming from there
                if (newDynamicProfileInfo == nullptr)
                {
                    newDynamicProfileInfo = DynamicProfileInfo::New(this->GetRecycler(), functionBody, true /* persistsAcrossScriptContexts */);
                    profileManager->UpdateDynamicProfileInfo(functionBody->GetLocalFunctionId(), newDynamicProfileInfo);
                    dynamicProfileInfo = newDynamicProfileInfo;
                }
                profileManager->MarkAsExecuted(functionBody->GetLocalFunctionId());
                newDynamicProfileInfo->UpdateFunctionInfo(functionBody, this->GetRecycler());
            }
            else
            {
                if (newDynamicProfileInfo == nullptr)
                {
                    newDynamicProfileInfo = functionBody->AllocateDynamicProfile();
                }
                dynamicProfileInfo = newDynamicProfileInfo;
            }
        }
        else
        {
            if (newDynamicProfileInfo == nullptr)
            {
                newDynamicProfileInfo = functionBody->AllocateDynamicProfile();
                dynamicProfileInfo = newDynamicProfileInfo;
            }
            Assert(functionBody->GetInterpretedCount() == 0);
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)

            if (this->Cache()->profileInfoList)
            {
                this->Cache()->profileInfoList->Prepend(this->GetRecycler(), newDynamicProfileInfo);
            }
#endif
            if (!startupComplete)
            {
                Assert(profileManager);
                profileManager->MarkAsExecuted(functionBody->GetLocalFunctionId());
            }
        }
        Assert(dynamicProfileInfo != nullptr);
    }